

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BumpAllocator.h
# Opt level: O0

ModportNamedPortSyntax * __thiscall
slang::BumpAllocator::emplace<slang::syntax::ModportNamedPortSyntax,slang::parsing::Token>
          (BumpAllocator *this,Token *args)

{
  Token name;
  ModportNamedPortSyntax *pMVar1;
  Info *in_RSI;
  BumpAllocator *in_RDI;
  size_t in_stack_ffffffffffffffe8;
  
  pMVar1 = (ModportNamedPortSyntax *)allocate(in_RDI,(size_t)in_RSI,in_stack_ffffffffffffffe8);
  name.info = in_RSI;
  name._0_8_ = in_RSI->location;
  slang::syntax::ModportNamedPortSyntax::ModportNamedPortSyntax
            ((ModportNamedPortSyntax *)in_RSI->rawTextPtr,name);
  return pMVar1;
}

Assistant:

T* emplace(Args&&... args) {
        static_assert(std::is_trivially_destructible_v<T>);
        return new (allocate(sizeof(T), alignof(T))) T(std::forward<Args>(args)...);
    }